

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlOutputter.cpp
# Opt level: O2

void __thiscall CppUnit::XmlOutputter::addStatistics(XmlOutputter *this,XmlElement *rootNode)

{
  int iVar1;
  XmlElement *this_00;
  XmlElement *pXVar2;
  _Map_pointer pppXVar3;
  _Elt_pointer ppXVar4;
  _Elt_pointer ppXVar5;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  allocator<char> local_32;
  allocator<char> local_31;
  
  this_00 = (XmlElement *)operator_new(0xe8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"Statistics",&local_31);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"",&local_32);
  XmlElement::XmlElement(this_00,&local_f8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  XmlElement::addElement(rootNode,this_00);
  pXVar2 = (XmlElement *)operator_new(0xe8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Tests",&local_31);
  iVar1 = (*(this->m_result->super_TestSuccessListener).super_TestListener._vptr_TestListener[0xb])
                    ();
  XmlElement::XmlElement(pXVar2,&local_b8,iVar1);
  XmlElement::addElement(this_00,pXVar2);
  std::__cxx11::string::~string((string *)&local_b8);
  pXVar2 = (XmlElement *)operator_new(0xe8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"FailuresTotal",&local_31);
  iVar1 = (*(this->m_result->super_TestSuccessListener).super_TestListener._vptr_TestListener[0xe])
                    ();
  XmlElement::XmlElement(pXVar2,&local_98,iVar1);
  XmlElement::addElement(this_00,pXVar2);
  std::__cxx11::string::~string((string *)&local_98);
  pXVar2 = (XmlElement *)operator_new(0xe8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"Errors",&local_31);
  iVar1 = (*(this->m_result->super_TestSuccessListener).super_TestListener._vptr_TestListener[0xc])
                    ();
  XmlElement::XmlElement(pXVar2,&local_78,iVar1);
  XmlElement::addElement(this_00,pXVar2);
  std::__cxx11::string::~string((string *)&local_78);
  pXVar2 = (XmlElement *)operator_new(0xe8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Failures",&local_31);
  iVar1 = (*(this->m_result->super_TestSuccessListener).super_TestListener._vptr_TestListener[0xd])
                    ();
  XmlElement::XmlElement(pXVar2,&local_58,iVar1);
  XmlElement::addElement(this_00,pXVar2);
  std::__cxx11::string::~string((string *)&local_58);
  ppXVar5 = (this->m_hooks).
            super__Deque_base<CppUnit::XmlOutputterHook_*,_std::allocator<CppUnit::XmlOutputterHook_*>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppXVar4 = (this->m_hooks).
            super__Deque_base<CppUnit::XmlOutputterHook_*,_std::allocator<CppUnit::XmlOutputterHook_*>_>
            ._M_impl.super__Deque_impl_data._M_start._M_last;
  pppXVar3 = (this->m_hooks).
             super__Deque_base<CppUnit::XmlOutputterHook_*,_std::allocator<CppUnit::XmlOutputterHook_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node;
  while (ppXVar5 !=
         (this->m_hooks).
         super__Deque_base<CppUnit::XmlOutputterHook_*,_std::allocator<CppUnit::XmlOutputterHook_*>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    (*(*ppXVar5)->_vptr_XmlOutputterHook[4])(*ppXVar5,this->m_xml,this_00);
    ppXVar5 = ppXVar5 + 1;
    if (ppXVar5 == ppXVar4) {
      ppXVar5 = pppXVar3[1];
      pppXVar3 = pppXVar3 + 1;
      ppXVar4 = ppXVar5 + 0x40;
    }
  }
  return;
}

Assistant:

void
XmlOutputter::addStatistics( XmlElement *rootNode )
{
  XmlElement *statisticsElement = new XmlElement( "Statistics" );
  rootNode->addElement( statisticsElement );
  statisticsElement->addElement( new XmlElement( "Tests", m_result->runTests() ) );
  statisticsElement->addElement( new XmlElement( "FailuresTotal", 
                                                 m_result->testFailuresTotal() ) );
  statisticsElement->addElement( new XmlElement( "Errors", m_result->testErrors() ) );
  statisticsElement->addElement( new XmlElement( "Failures", m_result->testFailures() ) );

  for ( Hooks::iterator it = m_hooks.begin(); it != m_hooks.end(); ++it )
    (*it)->statisticsAdded( m_xml, statisticsElement );
}